

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locdspnm.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::LocaleDisplayNamesImpl::languageDisplayName
          (LocaleDisplayNamesImpl *this,char *lang,UnicodeString *result)

{
  int iVar1;
  char *pcVar2;
  UnicodeString *pUVar3;
  UnicodeString UStack_58;
  
  iVar1 = strcmp("root",lang);
  if ((iVar1 != 0) && (pcVar2 = strchr(lang,0x5f), pcVar2 == (char *)0x0)) {
    if ((this->nameLength != UDISPCTX_LENGTH_SHORT) ||
       (ICUDataTable::get(&this->langData,"Languages%short",(char *)0x0,lang,result),
       (undefined1  [56])((undefined1  [56])result->fUnion & (undefined1  [56])0x1) !=
       (undefined1  [56])0x0)) {
      ICUDataTable::get(&this->langData,"Languages",(char *)0x0,lang,result);
    }
    adjustForUsageAndContext(this,kCapContextUsageLanguage,result);
    return result;
  }
  UnicodeString::UnicodeString(&UStack_58,lang,-1,kInvariant);
  pUVar3 = UnicodeString::moveFrom(result,&UStack_58);
  UnicodeString::~UnicodeString(&UStack_58);
  return pUVar3;
}

Assistant:

UnicodeString&
LocaleDisplayNamesImpl::languageDisplayName(const char* lang,
                                            UnicodeString& result) const {
    if (uprv_strcmp("root", lang) == 0 || uprv_strchr(lang, '_') != NULL) {
        return result = UnicodeString(lang, -1, US_INV);
    }
    if (nameLength == UDISPCTX_LENGTH_SHORT) {
        langData.get("Languages%short", lang, result);
        if (!result.isBogus()) {
            return adjustForUsageAndContext(kCapContextUsageLanguage, result);
        }
    }
    langData.get("Languages", lang, result);
    return adjustForUsageAndContext(kCapContextUsageLanguage, result);
}